

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::CollectedFuncInfo,(wasm::
Mutability)0,wasm::ModuleUtils::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::
function<void(wasm::Function*,wasm::(anonymous_namespace)::CollectedFuncInfo&)>)::Mapper::
Mapper(wasm::Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)::CollectedFuncInfo,std::
less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
CollectedFuncInfo>>>&,std::function<void(wasm::Function*,wasm::(anonymous)::CollectedFuncInfo__>_
          (void *this,Module *module,Map *map,Func *work)

{
  *(undefined8 *)((long)this + 8) = 0;
  *(long *)((long)this + 0x10) = (long)this + 0x20;
  *(undefined8 *)((long)this + 0x18) = 0;
  *(undefined1 *)((long)this + 0x20) = 0;
  *(undefined8 *)((long)this + 0x30) = 0;
  *(undefined8 *)((long)this + 0x38) = 0;
  *(undefined8 *)((long)this + 0xe0) = 0;
  *(undefined8 *)((long)this + 0xe8) = 0;
  *(undefined8 *)((long)this + 0xf0) = 0;
  *(undefined8 *)((long)this + 0xf8) = 0;
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined ***)this = &PTR__Mapper_00e222f8;
  *(Module **)((long)this + 0x108) = module;
  *(Map **)((long)this + 0x110) = map;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::CollectedFuncInfo_&)>::function
            ((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::CollectedFuncInfo_&)> *)
             ((long)this + 0x118),
             (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::CollectedFuncInfo_&)> *)
             work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}